

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

uint64_t flatbuffers::anon_unknown_0::HashFile(char *source_filename,char *source)

{
  byte bVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  string local_68;
  string local_48;
  
  uVar5 = 0xcbf29ce484222645;
  if (source_filename == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar2 = strlen(source_filename);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,source_filename,source_filename + sVar2);
    StripPath(&local_48,&local_68);
    bVar1 = *local_48._M_dataplus._M_p;
    uVar6 = 0xcbf29ce484222645;
    if (bVar1 != 0) {
      uVar6 = 0xcbf29ce484222645;
      _Var3._M_p = local_48._M_dataplus._M_p;
      do {
        _Var3._M_p = _Var3._M_p + 1;
        uVar6 = (bVar1 ^ uVar6) * 0x100000001b3;
        bVar1 = *_Var3._M_p;
      } while (bVar1 != 0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((source != (char *)0x0) && (bVar1 = *source, bVar1 != 0)) {
    pbVar4 = (byte *)(source + 1);
    do {
      uVar5 = (uVar5 ^ bVar1) * 0x100000001b3;
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (bVar1 != 0);
    uVar6 = uVar6 ^ uVar5;
  }
  return uVar6;
}

Assistant:

static uint64_t HashFile(const char *source_filename, const char *source) {
  uint64_t hash = 0;

  if (source_filename)
    hash = HashFnv1a<uint64_t>(StripPath(source_filename).c_str());

  if (source && *source) hash ^= HashFnv1a<uint64_t>(source);

  return hash;
}